

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
BamTools::BamAlignment::GetTagNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,BamAlignment *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  undefined8 uVar4;
  uint uVar5;
  char *pcVar6;
  uint local_5c;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((this->SupportData).HasCoreOnly == false) &&
      (sVar2 = (this->TagData)._M_string_length, sVar2 != 0)) && (uVar5 = (uint)sVar2, uVar5 != 0))
  {
    pcVar6 = (this->TagData)._M_dataplus._M_p;
    paVar1 = &local_50.field_2;
    local_58 = pcVar6 + 3;
    local_5c = 3;
    if (pcVar6 == (char *)0x0) {
      local_50._M_dataplus._M_p = (pointer)paVar1;
      uVar4 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__return_storage_ptr__);
      _Unwind_Resume(uVar4);
    }
    while( true ) {
      local_50.field_2._M_allocated_capacity._0_2_ = *(undefined2 *)pcVar6;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (pcVar6[2] == '\0') break;
      bVar3 = SkipToNextTag(this,pcVar6[2],&local_58,&local_5c);
      if (!bVar3) {
        return __return_storage_ptr__;
      }
      if (*local_58 == '\0') {
        return __return_storage_ptr__;
      }
      if (uVar5 <= local_5c) {
        return __return_storage_ptr__;
      }
      local_5c = local_5c + 3;
      pcVar6 = local_58;
      local_58 = local_58 + 3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> BamAlignment::GetTagNames() const
{

    std::vector<std::string> result;
    if (SupportData.HasCoreOnly || TagData.empty()) {
        return result;
    }

    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;
    while (numBytesParsed < tagDataLength) {

        // get current tag name & type
        const char* pTagName = pTagData;
        const char* pTagType = pTagData + 2;
        pTagData += 3;
        numBytesParsed += 3;

        // store tag name
        result.push_back(std::string(pTagName, 2));

        // find the next tag
        if (*pTagType == '\0') {
            break;
        }
        if (!SkipToNextTag(*pTagType, pTagData, numBytesParsed)) {
            break;
        }
        if (*pTagData == '\0') {
            break;
        }
    }

    return result;
}